

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

_Bool extract_if_dead(connectdata *conn,Curl_easy *data)

{
  Curl_easy *pCVar1;
  uint uVar2;
  Curl_easy *olddata;
  uint state;
  _Bool dead;
  Curl_easy *data_local;
  connectdata *conn_local;
  
  if (((conn->easyq).size == 0) && (conn->data == (Curl_easy *)0x0)) {
    if (conn->handler->connection_check == (_func_uint_connectdata_ptr_uint *)0x0) {
      olddata._7_1_ = SocketIsDead(conn->sock[0]);
    }
    else {
      pCVar1 = conn->data;
      conn->data = data;
      uVar2 = (*conn->handler->connection_check)(conn,1);
      conn->data = pCVar1;
      olddata._7_1_ = (uVar2 & 1) != 0;
    }
    if (olddata._7_1_ != false) {
      Curl_infof(data,"Connection %ld seems to be dead!\n",conn->connection_id);
      Curl_conncache_remove_conn(data,conn,false);
      return true;
    }
  }
  return false;
}

Assistant:

static bool extract_if_dead(struct connectdata *conn,
                            struct Curl_easy *data)
{
  if(!CONN_INUSE(conn) && !conn->data) {
    /* The check for a dead socket makes sense only if the connection isn't in
       use */
    bool dead;
    if(conn->handler->connection_check) {
      /* The protocol has a special method for checking the state of the
         connection. Use it to check if the connection is dead. */
      unsigned int state;
      struct Curl_easy *olddata = conn->data;
      conn->data = data; /* use this transfer for now */
      state = conn->handler->connection_check(conn, CONNCHECK_ISDEAD);
      conn->data = olddata;
      dead = (state & CONNRESULT_DEAD);
    }
    else {
      /* Use the general method for determining the death of a connection */
      dead = SocketIsDead(conn->sock[FIRSTSOCKET]);
    }

    if(dead) {
      infof(data, "Connection %ld seems to be dead!\n", conn->connection_id);
      Curl_conncache_remove_conn(data, conn, FALSE);
      return TRUE;
    }
  }
  return FALSE;
}